

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O3

string * pybind11::type_id<float>(void)

{
  string *extraout_RAX;
  string *in_RDI;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,_PySequence_Size + (*_PySequence_Size == '*'),&local_11);
  detail::clean_type_id(in_RDI);
  return extraout_RAX;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}